

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O0

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,8,0,-1,8>>::
_solve_impl<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,8,1,0,8,1>>
          (ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>> *this,
          Matrix<float,__1,_1,_0,__1,_1> *rhs,Matrix<float,_8,_1,_0,_8,_1> *dst)

{
  long lVar1;
  HouseholderSequence<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_Eigen::Matrix<float,__1,_1,_0,_8,_1>,_1>
  *this_00;
  PlainObjectBase<Eigen::Matrix<int,_8,_1,_0,_8,_1>_> *pPVar2;
  Scalar *pSVar3;
  Index IVar4;
  RowXpr local_1e0;
  long local_1b0;
  Index i_1;
  RowXpr local_178;
  Index local_148;
  Index i;
  Type local_108;
  Type local_d0;
  HouseholderSequenceType local_88;
  AdjointReturnType local_60;
  undefined1 local_38 [8];
  PlainObject c;
  Index nonzero_pivots;
  Matrix<float,_8,_1,_0,_8,_1> *dst_local;
  Matrix<float,__1,_1,_0,__1,_1> *rhs_local;
  ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *this_local;
  
  c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       ColPivHouseholderQR<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::nonzeroPivots
                 ((ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)this);
  if (c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0) {
    DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_> *)dst);
  }
  else {
    Matrix<float,_-1,_1,_0,_-1,_1>::Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_38,rhs);
    ColPivHouseholderQR<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::householderQ
              (&local_88,(ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)this);
    this_00 = HouseholderSequence<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_Eigen::Matrix<float,_-1,_1,_0,_8,_1>,_1>
              ::setLength(&local_88,
                          c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
    HouseholderSequence<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_Eigen::Matrix<float,_-1,_1,_0,_8,_1>,_1>
    ::adjoint(&local_60,this_00);
    MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    applyOnTheLeft<Eigen::HouseholderSequence<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::Matrix<float,_1,1,0,8,1>,1>>
              ((MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_38,
               (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_Eigen::Matrix<float,__1,_1,_0,_8,_1>,_1>_>
                *)&local_60);
    DenseBase<Eigen::Matrix<float,-1,8,0,-1,8>>::topLeftCorner<long,long>
              (&local_108,(DenseBase<Eigen::Matrix<float,_1,8,0,_1,8>> *)this,
               c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>const,-1,-1,false>>::triangularView<2u>
              (&local_d0,&local_108);
    DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::topRows<long>
              ((Type *)&i,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_38,
               c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>const,-1,-1,false>const,2u,Eigen::Dense>
    ::solveInPlace<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,1,false>>
              ((TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>const,_1,_1,false>const,2u,Eigen::Dense>
                *)&local_d0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)&i)
    ;
    for (local_148 = 0;
        local_148 < c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        ; local_148 = local_148 + 1) {
      DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::row
                (&local_178,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_38,local_148)
      ;
      pPVar2 = &PermutationMatrix<8,_8,_int>::indices((PermutationMatrix<8,_8,_int> *)(this + 0x40))
                ->super_PlainObjectBase<Eigen::Matrix<int,_8,_1,_0,_8,_1>_>;
      pSVar3 = PlainObjectBase<Eigen::Matrix<int,_8,_1,_0,_8,_1>_>::coeff(pPVar2,local_148);
      DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>::row
                ((RowXpr *)&i_1,(DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_> *)dst,(long)*pSVar3
                );
      Block<Eigen::Matrix<float,8,1,0,8,1>,1,1,false>::operator=
                ((Block<Eigen::Matrix<float,8,1,0,8,1>,1,1,false> *)&i_1,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
                 &local_178);
    }
    local_1b0 = c.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    while( true ) {
      lVar1 = local_1b0;
      IVar4 = ColPivHouseholderQR<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::cols
                        ((ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)this);
      if (IVar4 <= lVar1) break;
      pPVar2 = &PermutationMatrix<8,_8,_int>::indices((PermutationMatrix<8,_8,_int> *)(this + 0x40))
                ->super_PlainObjectBase<Eigen::Matrix<int,_8,_1,_0,_8,_1>_>;
      pSVar3 = PlainObjectBase<Eigen::Matrix<int,_8,_1,_0,_8,_1>_>::coeff(pPVar2,local_1b0);
      DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>::row
                (&local_1e0,(DenseBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_> *)dst,(long)*pSVar3);
      DenseBase<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>::setZero
                ((DenseBase<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_> *)
                 &local_1e0);
      local_1b0 = local_1b0 + 1;
    }
    Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_38);
  }
  return;
}

Assistant:

void ColPivHouseholderQR<_MatrixType>::_solve_impl(const RhsType &rhs, DstType &dst) const
{
  const Index nonzero_pivots = nonzeroPivots();

  if(nonzero_pivots == 0)
  {
    dst.setZero();
    return;
  }

  typename RhsType::PlainObject c(rhs);

  c.applyOnTheLeft(householderQ().setLength(nonzero_pivots).adjoint() );

  m_qr.topLeftCorner(nonzero_pivots, nonzero_pivots)
      .template triangularView<Upper>()
      .solveInPlace(c.topRows(nonzero_pivots));

  for(Index i = 0; i < nonzero_pivots; ++i) dst.row(m_colsPermutation.indices().coeff(i)) = c.row(i);
  for(Index i = nonzero_pivots; i < cols(); ++i) dst.row(m_colsPermutation.indices().coeff(i)).setZero();
}